

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptActions
          (cmInstallDirectoryGenerator *this,ostream *os,Indent indent)

{
  allocator<char> local_41;
  string local_40;
  
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions((cmScriptGenerator *)this,os,indent);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  AddDirectoryInstallRule(this,os,&local_40,indent,&this->Directories);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptActions(std::ostream& os,
                                                        Indent indent)
{
  if (this->ActionsPerConfig) {
    this->cmInstallGenerator::GenerateScriptActions(os, indent);
  } else {
    this->AddDirectoryInstallRule(os, "", indent, this->Directories);
  }
}